

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_grid.hpp
# Opt level: O2

spherical_grid_ptr __thiscall
IntegratorXX::detail::
make_pruned_grid_impl<IntegratorXX::Womersley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
          (detail *this,
          RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
          *rq,vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
              *pruning_regions)

{
  pointer pPVar1;
  size_t idx;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pPVar2;
  spherical_grid_ptr sVar3;
  RadialGridPartition<IntegratorXX::Womersley<double>_> rgp;
  RadialGridPartition<IntegratorXX::Womersley<double>_> local_98;
  QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_60;
  
  local_98.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.partition_idx_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (pruning_regions->
           super__Vector_base<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (pruning_regions->
                super__Vector_base<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
                )._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    idx = pPVar2->idx_st;
    Womersley<double>::Womersley((Womersley<double> *)&local_60,pPVar2->angular_size);
    RadialGridPartition<IntegratorXX::Womersley<double>>::
    add_quad<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
              ((RadialGridPartition<IntegratorXX::Womersley<double>> *)&local_98,rq,idx,
               (Quadrature<IntegratorXX::Womersley<double>_> *)&local_60);
    QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
    ::~QuadratureBase(&local_60);
  }
  RadialGridPartition<IntegratorXX::Womersley<double>>::
  finalize<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
            ((RadialGridPartition<IntegratorXX::Womersley<double>> *)&local_98,rq);
  SphericalGridFactory::
  generate_pruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>const&,IntegratorXX::RadialGridPartition<IntegratorXX::Womersley<double>>>
            ((RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
              *)this,(RadialGridPartition<IntegratorXX::Womersley<double>_> *)rq);
  RadialGridPartition<IntegratorXX::Womersley<double>_>::~RadialGridPartition(&local_98);
  sVar3.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (spherical_grid_ptr)
         sVar3.
         super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto make_pruned_grid_impl(const RadialQuadType& rq, 
  const std::vector<PruningRegion>& pruning_regions) {

  RadialGridPartition<AngularQuadType> rgp;
  for( auto& region : pruning_regions ) {
    rgp.add_quad( rq, region.idx_st, AngularQuadType(region.angular_size) );
  }
  rgp.finalize(rq);

  return SphericalGridFactory::generate_pruned_grid(rq, std::move(rgp));

}